

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_10e49f::readWriteTest(string *tempDir,int channelCount,int testTimes)

{
  pointer pcVar1;
  ostream *poVar2;
  ulong uVar3;
  Compression compression;
  string filename;
  string local_90;
  string local_70;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,channelCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," channels ",10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,testTimes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ostream::flush();
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  if (0 < testTimes) {
    uVar3 = 0;
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      compression = (int)uVar3 + (int)(uVar3 / 3) * -3;
      generateRandomFile(&local_50,channelCount,compression,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      readFile(&local_90,channelCount,false,false);
      if (1 < channelCount) {
        readFile(&local_90,channelCount,false,true);
      }
      remove(local_90._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::ostream::flush();
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      generateRandomFile(&local_70,channelCount,compression,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      readFile(&local_90,channelCount,true,false);
      if (1 < channelCount) {
        readFile(&local_90,channelCount,true,true);
      }
      remove(local_90._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      std::ostream::flush();
      uVar3 = (ulong)((int)uVar3 + 1);
      testTimes = testTimes + -1;
    } while (testTimes != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void readWriteTest(const std::string & tempDir, int channelCount, int testTimes)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes << " times."
         << endl << flush;

    std::string filename = tempDir + "imf_test_deep_scanline_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0:
                compression = NO_COMPRESSION;
                break;
            case 1:
                compression = RLE_COMPRESSION;
                break;
            case 2:
                compression = ZIPS_COMPRESSION;
                break;
        }

        generateRandomFile (filename, channelCount, compression, false);
        readFile (filename, channelCount, false , false );
	if (channelCount>1)
	    readFile (filename, channelCount, false , true );
        remove (filename.c_str());
        cout << endl << flush;

        generateRandomFile (filename, channelCount, compression, true);
        readFile (filename, channelCount, true , false );
	if (channelCount>1)
	    readFile (filename, channelCount, true , true );
        remove (filename.c_str());
        cout << endl << flush;
    }
}